

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection *
address_space_translate_iommu
          (MemoryRegionSection *__return_storage_ptr__,IOMMUMemoryRegion *iommu_mr,hwaddr *xlat,
          hwaddr *plen_out,hwaddr *page_mask_out,_Bool is_write,_Bool is_mmio,
          AddressSpace **target_as,MemTxAttrs attrs)

{
  _func_int_IOMMUMemoryRegion_ptr_MemTxAttrs *p_Var1;
  undefined8 uVar2;
  MemoryRegion *pMVar3;
  FlatView *pFVar4;
  hwaddr hVar5;
  hwaddr hVar6;
  undefined8 uVar7;
  Int128 IVar8;
  undefined7 uVar9;
  int iVar10;
  MemoryRegionSection *pMVar11;
  ulong uVar12;
  undefined7 in_register_00000089;
  ulong addr;
  IOMMUMemoryRegion *pIVar13;
  MemTxAttrs in_stack_ffffffffffffff88;
  IOMMUTLBEntry local_58;
  
  pIVar13 = iommu_mr;
  do {
    uVar12 = *xlat;
    p_Var1 = (pIVar13->cc).attrs_to_index;
    if (p_Var1 == (_func_int_IOMMUMemoryRegion_ptr_MemTxAttrs *)0x0) {
      iVar10 = 0;
    }
    else {
      iVar10 = (*p_Var1)(pIVar13,in_stack_ffffffffffffff88);
    }
    (*(pIVar13->cc).translate)(&local_58,pIVar13,uVar12,(int)page_mask_out + IOMMU_RO,iVar10);
    if ((local_58.perm & 1 << ((byte)page_mask_out & 0x1f)) == IOMMU_NONE) {
      *(undefined8 *)&__return_storage_ptr__->readonly = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
      __return_storage_ptr__->offset_within_region = 0;
      __return_storage_ptr__->offset_within_address_space = 0;
      __return_storage_ptr__->mr = (MemoryRegion *)0x0;
      __return_storage_ptr__->fv = (FlatView *)0x0;
      *(undefined8 *)&__return_storage_ptr__->size = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = 0;
      __return_storage_ptr__->mr = &((iommu_mr->parent_obj).uc)->io_mem_unassigned;
      return __return_storage_ptr__;
    }
    addr = (uVar12 ^ local_58.translated_addr) & local_58.addr_mask ^ local_58.translated_addr;
    uVar12 = ((local_58.addr_mask | local_58.translated_addr) - addr) + 1;
    if (*plen_out < uVar12) {
      uVar12 = *plen_out;
    }
    *plen_out = uVar12;
    *(AddressSpace **)CONCAT71(in_register_00000089,is_write) = local_58.target_as;
    pMVar11 = address_space_translate_internal
                        ((local_58.target_as)->current_map->dispatch,addr,xlat,plen_out,true);
    pIVar13 = (IOMMUMemoryRegion *)pMVar11->mr;
  } while ((pIVar13 != (IOMMUMemoryRegion *)0x0) && ((pIVar13->parent_obj).is_iommu != false));
  IVar8 = pMVar11->size;
  uVar2 = *(undefined8 *)((long)&pMVar11->size + 8);
  pMVar3 = pMVar11->mr;
  pFVar4 = pMVar11->fv;
  hVar5 = pMVar11->offset_within_region;
  hVar6 = pMVar11->offset_within_address_space;
  uVar9 = *(undefined7 *)&pMVar11->field_0x31;
  uVar7 = *(undefined8 *)&pMVar11->field_0x38;
  __return_storage_ptr__->readonly = pMVar11->readonly;
  *(undefined7 *)&__return_storage_ptr__->field_0x31 = uVar9;
  *(undefined8 *)&__return_storage_ptr__->field_0x38 = uVar7;
  __return_storage_ptr__->offset_within_region = hVar5;
  __return_storage_ptr__->offset_within_address_space = hVar6;
  __return_storage_ptr__->mr = pMVar3;
  __return_storage_ptr__->fv = pFVar4;
  *(long *)&__return_storage_ptr__->size = (long)IVar8;
  *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

static MemoryRegionSection address_space_translate_iommu(IOMMUMemoryRegion *iommu_mr,
                                                         hwaddr *xlat,
                                                         hwaddr *plen_out,
                                                         hwaddr *page_mask_out,
                                                         bool is_write,
                                                         bool is_mmio,
                                                         AddressSpace **target_as,
                                                         MemTxAttrs attrs)
{
    MemoryRegionSection *section;
    hwaddr page_mask = (hwaddr)-1;
    MemoryRegion *mr = MEMORY_REGION(iommu_mr);

    do {
        hwaddr addr = *xlat;
        IOMMUMemoryRegionClass *imrc = memory_region_get_iommu_class_nocheck(iommu_mr);
        int iommu_idx = 0;
        IOMMUTLBEntry iotlb;

        if (imrc->attrs_to_index) {
            iommu_idx = imrc->attrs_to_index(iommu_mr, attrs);
        }

        iotlb = imrc->translate(iommu_mr, addr, is_write ?
                                IOMMU_WO : IOMMU_RO, iommu_idx);

        if (!(iotlb.perm & (1 << is_write))) {
            goto unassigned;
        }

        addr = ((iotlb.translated_addr & ~iotlb.addr_mask)
                | (addr & iotlb.addr_mask));
        page_mask &= iotlb.addr_mask;
        *plen_out = MIN(*plen_out, (addr | iotlb.addr_mask) - addr + 1);
        *target_as = iotlb.target_as;

        section = address_space_translate_internal(
                address_space_to_dispatch(iotlb.target_as), addr, xlat,
                plen_out, is_mmio);

        iommu_mr = memory_region_get_iommu(section->mr);
    } while (unlikely(iommu_mr));

    if (page_mask_out) {
        *page_mask_out = page_mask;
    }
    return *section;

unassigned:
    return (MemoryRegionSection) { .mr = &(mr->uc->io_mem_unassigned) };
}